

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::UniformInfoQueryCase::test
          (UniformInfoQueryCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  ostringstream *poVar1;
  deUint32 programGL;
  TestLog *log;
  bool bVar2;
  CaseType CVar3;
  ScopedLogSection section;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  basicUniformReportsUniformsiv;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  basicUniformReportsUniform;
  allocator<char> local_212;
  allocator<char> local_211;
  ScopedLogSection local_210;
  string local_208;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  local_1e8;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  local_1c8;
  undefined1 local_1a8 [384];
  
  programGL = (program->m_program).m_program;
  log = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1c8.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CVar3 = this->m_caseType;
  if ((CVar3 & ~CASETYPE_CONSISTENCY) == CASETYPE_UNIFORM) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"InfoGetActiveUniform",&local_211);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Uniform information queries with glGetActiveUniform()",
               &local_212);
    tcu::ScopedLogSection::ScopedLogSection(&local_210,log,(string *)local_1a8,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)local_1a8);
    bVar2 = UniformCase::getActiveUniforms
                      (&this->super_UniformCase,&local_1c8,basicUniformReportsRef,programGL);
    tcu::ScopedLogSection::~ScopedLogSection(&local_210);
    CVar3 = this->m_caseType;
    if (bVar2) goto LAB_010ac59e;
    if (CVar3 != CASETYPE_UNIFORM) {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "// Note: this is a consistency case, so ignoring above failure(s)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      CVar3 = this->m_caseType;
      goto LAB_010ac59e;
    }
LAB_010ac6ef:
    bVar2 = false;
  }
  else {
LAB_010ac59e:
    if (CVar3 - CASETYPE_INDICES_UNIFORMSIV < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"InfoGetActiveUniformsiv",&local_211);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,
                 "Uniform information queries with glGetUniformIndices() and glGetActiveUniformsiv()"
                 ,&local_212);
      tcu::ScopedLogSection::ScopedLogSection(&local_210,log,(string *)local_1a8,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)local_1a8);
      bVar2 = UniformCase::getActiveUniformsiv
                        (&this->super_UniformCase,&local_1e8,basicUniformReportsRef,programGL);
      tcu::ScopedLogSection::~ScopedLogSection(&local_210);
      if (!bVar2) {
        if (this->m_caseType == CASETYPE_INDICES_UNIFORMSIV) goto LAB_010ac6ef;
        poVar1 = (ostringstream *)(local_1a8 + 8);
        local_1a8._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "// Note: this is a consistency case, so ignoring above failure(s)");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      if (this->m_caseType == CASETYPE_CONSISTENCY) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,"CompareUniformVsUniformsiv",&local_211);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()",
                   &local_212);
        tcu::ScopedLogSection::ScopedLogSection(&local_210,log,(string *)local_1a8,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)local_1a8);
        bVar2 = UniformCase::uniformVsUniformsivComparison
                          (&this->super_UniformCase,&local_1c8,&local_1e8);
        tcu::ScopedLogSection::~ScopedLogSection(&local_210);
        if (!bVar2) goto LAB_010ac6ef;
      }
    }
    bVar2 = true;
  }
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector(&local_1e8);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector(&local_1c8);
  return bVar2;
}

Assistant:

bool UniformInfoQueryCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	DE_UNREF(basicUniforms);
	DE_UNREF(rnd);

	const deUint32					programGL	= program.getProgram();
	TestLog&						log			= m_testCtx.getLog();
	vector<BasicUniformReportGL>	basicUniformReportsUniform;
	vector<BasicUniformReportGL>	basicUniformReportsUniformsiv;

	if (m_caseType == CASETYPE_UNIFORM || m_caseType == CASETYPE_CONSISTENCY)
	{
		bool success = false;

		{
			const ScopedLogSection section(log, "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
			success = getActiveUniforms(basicUniformReportsUniform, basicUniformReportsRef, programGL);
		}

		if (!success)
		{
			if (m_caseType == CASETYPE_UNIFORM)
				return false;
			else
			{
				DE_ASSERT(m_caseType == CASETYPE_CONSISTENCY);
				log << TestLog::Message << "// Note: this is a consistency case, so ignoring above failure(s)" << TestLog::EndMessage;
			}
		}
	}

	if (m_caseType == CASETYPE_INDICES_UNIFORMSIV || m_caseType == CASETYPE_CONSISTENCY)
	{
		bool success = false;

		{
			const ScopedLogSection section(log, "InfoGetActiveUniformsiv", "Uniform information queries with glGetUniformIndices() and glGetActiveUniformsiv()");
			success = getActiveUniformsiv(basicUniformReportsUniformsiv, basicUniformReportsRef, programGL);
		}

		if (!success)
		{
			if (m_caseType == CASETYPE_INDICES_UNIFORMSIV)
				return false;
			else
			{
				DE_ASSERT(m_caseType == CASETYPE_CONSISTENCY);
				log << TestLog::Message << "// Note: this is a consistency case, so ignoring above failure(s)" << TestLog::EndMessage;
			}
		}
	}

	if (m_caseType == CASETYPE_CONSISTENCY)
	{
		bool success = false;

		{
			const ScopedLogSection section(log, "CompareUniformVsUniformsiv", "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()");
			success = uniformVsUniformsivComparison(basicUniformReportsUniform, basicUniformReportsUniformsiv);
		}

		if (!success)
			return false;
	}

	return true;
}